

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<6UL,_GF2::MOLex<6UL>_> * __thiscall
GF2::MP<6UL,_GF2::MOLex<6UL>_>::operator*=(MP<6UL,_GF2::MOLex<6UL>_> *this,MM<6UL> *mRight)

{
  bool bVar1;
  MM<6UL> *in_RSI;
  MP<6UL,_GF2::MOLex<6UL>_> *in_RDI;
  iterator iter;
  list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *in_stack_ffffffffffffffc8;
  MM<6UL> *this_00;
  _Self local_20;
  _Self local_18;
  MM<6UL> *local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::begin
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::end
                   (in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = local_10;
    std::_List_iterator<GF2::MM<6UL>_>::operator*((_List_iterator<GF2::MM<6UL>_> *)0x19786a);
    MM<6ul>::operator*=(this_00,(MM<6UL> *)in_stack_ffffffffffffffc8);
    std::_List_iterator<GF2::MM<6UL>_>::operator++(&local_18);
  }
  Normalize(this);
  return in_RDI;
}

Assistant:

MP& operator*=(const MM<_n>& mRight)
	{	
		for (iterator iter = begin(); iter != end(); ++iter)
			(*iter) *= mRight;
		// при умножении могут появиться повторяющиеся мономы 
		// и может нарушиться порядок
		Normalize();
		return *this;
	}